

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O2

case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
* __thiscall
boost::xpressive::detail::
case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
::operator=(case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
            *this,char ch)

{
  transform_op tVar1;
  int iVar2;
  char local_9;
  
  tVar1 = this->next_;
  if (tVar1 == op_none) {
    tVar1 = this->rest_;
  }
  local_9 = ch;
  if (tVar1 == op_upper) {
    iVar2 = (*this->traits_->_vptr_traits[3])(this->traits_,(ulong)(uint)(int)ch);
    local_9 = (char)iVar2;
  }
  else if (tVar1 == op_lower) {
    iVar2 = (*this->traits_->_vptr_traits[2])(this->traits_,(ulong)(uint)(int)ch);
    local_9 = (char)iVar2;
  }
  std::
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(&this->out_,&local_9);
  return this;
}

Assistant:

case_converting_iterator &operator =(Char ch)
    {
        switch(this->next_ ? this->next_ : this->rest_)
        {
        case op_lower:
            ch = this->traits_->tolower(ch);
            break;

        case op_upper:
            ch = this->traits_->toupper(ch);
            break;

        default:;
        }

        *this->out_ = ch;
        return *this;
    }